

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

void __thiscall
glslang::TIntermediate::mergeGlobalUniformBlocks
          (TIntermediate *this,TInfoSink *infoSink,TIntermediate *unit,bool mergeExistingOnly)

{
  uint uVar1;
  long *plVar2;
  TIntermNode *pTVar3;
  iterator __position;
  int iVar4;
  TIntermAggregate *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar7;
  undefined4 extraout_var_02;
  TIntermSymbol *block;
  TIntermSymbol *unitBlock;
  undefined4 extraout_var_05;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  undefined4 extraout_var_06;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__str;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TIntermNode **__args;
  bool bVar8;
  long *plVar9;
  TIntermNode **ppTVar10;
  TIntermNode *local_a0;
  TPoolAllocator *local_98;
  TIntermNode **local_90;
  iterator iStack_88;
  TIntermNode **local_80;
  TPoolAllocator *local_78;
  TIntermNode **local_70;
  iterator iStack_68;
  TIntermNode **local_60;
  long local_58;
  vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *local_50;
  TIntermediate *local_48;
  TInfoSink *local_40;
  TIntermediate *local_38;
  vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *pvVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  local_48 = this;
  local_40 = infoSink;
  pTVar5 = findLinkerObjects(this);
  iVar4 = (*(pTVar5->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar5);
  pvVar6 = (vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
           CONCAT44(extraout_var,iVar4);
  local_38 = unit;
  pTVar5 = findLinkerObjects(unit);
  iVar4 = (*(pTVar5->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar5);
  local_58 = CONCAT44(extraout_var_00,iVar4);
  local_78 = GetThreadPoolAllocator();
  local_70 = (TIntermNode **)0x0;
  iStack_68._M_current = (TIntermNode **)0x0;
  local_60 = (TIntermNode **)0x0;
  local_98 = GetThreadPoolAllocator();
  local_90 = (TIntermNode **)0x0;
  iStack_88._M_current = (TIntermNode **)0x0;
  local_80 = (TIntermNode **)0x0;
  plVar9 = *(long **)(pvVar6 + 8);
  plVar2 = *(long **)(pvVar6 + 0x10);
  local_50 = pvVar6;
  if (plVar9 != plVar2) {
    do {
      pTVar3 = (TIntermNode *)*plVar9;
      local_a0 = pTVar3;
      iVar4 = (*pTVar3->_vptr_TIntermNode[0xc])(pTVar3);
      lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x108))
                        ((long *)CONCAT44(extraout_var_01,iVar4));
      if ((*(ulong *)(lVar7 + 8) & 0x800000000) != 0) {
        if (iStack_68._M_current == local_60) {
          std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
          _M_realloc_insert<TIntermNode*const&>
                    ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)&local_78,
                     iStack_68,&local_a0);
        }
        else {
          *iStack_68._M_current = pTVar3;
          iStack_68._M_current = iStack_68._M_current + 1;
        }
      }
      plVar9 = plVar9 + 1;
    } while (plVar9 != plVar2);
  }
  plVar9 = *(long **)(local_58 + 8);
  plVar2 = *(long **)(local_58 + 0x10);
  if (plVar9 != plVar2) {
    do {
      pTVar3 = (TIntermNode *)*plVar9;
      local_a0 = pTVar3;
      iVar4 = (*pTVar3->_vptr_TIntermNode[0xc])(pTVar3);
      lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x108))
                        ((long *)CONCAT44(extraout_var_02,iVar4));
      if ((*(ulong *)(lVar7 + 8) & 0x800000000) != 0) {
        if (iStack_88._M_current == local_80) {
          std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
          _M_realloc_insert<TIntermNode*const&>
                    ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)&local_98,
                     iStack_88,&local_a0);
        }
        else {
          *iStack_88._M_current = pTVar3;
          iStack_88._M_current = iStack_88._M_current + 1;
        }
      }
      plVar9 = plVar9 + 1;
    } while (plVar9 != plVar2);
    if (local_90 != iStack_88._M_current) {
      __args = local_90;
      do {
        ppTVar10 = local_70;
        bVar8 = !mergeExistingOnly;
        if (local_70 != iStack_68._M_current) {
          do {
            iVar4 = (*(*ppTVar10)->_vptr_TIntermNode[0xc])();
            block = (TIntermSymbol *)CONCAT44(extraout_var_03,iVar4);
            iVar4 = (*(*__args)->_vptr_TIntermNode[0xc])();
            unitBlock = (TIntermSymbol *)CONCAT44(extraout_var_04,iVar4);
            if ((block == (TIntermSymbol *)0x0) || (unitBlock == (TIntermSymbol *)0x0)) {
              __assert_fail("block && unitBlock",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                            ,0x2ae,
                            "void glslang::TIntermediate::mergeGlobalUniformBlocks(TInfoSink &, TIntermediate &, bool)"
                           );
            }
            iVar4 = (*(block->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(block);
            this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 0x28))
                                ((long *)CONCAT44(extraout_var_05,iVar4));
            iVar4 = (*(unitBlock->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                              (unitBlock);
            __str = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 0x28))
                              ((long *)CONCAT44(extraout_var_06,iVar4));
            iVar4 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(this_00,__str);
            if (iVar4 == 0) {
              iVar4 = (*(block->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])
                                (block);
              uVar1 = *(uint *)(CONCAT44(extraout_var_07,iVar4) + 8);
              iVar4 = (*(unitBlock->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])
                                (unitBlock);
              if (((uVar1 ^ *(uint *)(CONCAT44(extraout_var_08,iVar4) + 8)) & 0x7f) == 0) {
                mergeBlockDefinitions(local_48,local_40,block,unitBlock,local_38);
                bVar8 = false;
              }
            }
            ppTVar10 = ppTVar10 + 1;
          } while (ppTVar10 != iStack_68._M_current);
        }
        if (bVar8) {
          __position._M_current = *(TIntermNode ***)(local_50 + 0x10);
          if (__position._M_current == *(TIntermNode ***)(local_50 + 0x18)) {
            std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
            _M_realloc_insert<TIntermNode*const&>(local_50,__position,__args);
          }
          else {
            *__position._M_current = *__args;
            *(long *)(local_50 + 0x10) = *(long *)(local_50 + 0x10) + 8;
          }
        }
        __args = __args + 1;
      } while (__args != iStack_88._M_current);
    }
  }
  return;
}

Assistant:

void TIntermediate::mergeGlobalUniformBlocks(TInfoSink& infoSink, TIntermediate& unit, bool mergeExistingOnly)
{
    TIntermSequence& linkerObjects = findLinkerObjects()->getSequence();
    TIntermSequence& unitLinkerObjects = unit.findLinkerObjects()->getSequence();

    // build lists of default blocks from the intermediates
    TIntermSequence defaultBlocks;
    TIntermSequence unitDefaultBlocks;

    auto filter = [](TIntermSequence& list, TIntermNode* node) {
        if (node->getAsSymbolNode()->getQualifier().defaultBlock) {
            list.push_back(node);
        }
    };

    std::for_each(linkerObjects.begin(), linkerObjects.end(),
        [&defaultBlocks, &filter](TIntermNode* node) {
            filter(defaultBlocks, node);
        });
    std::for_each(unitLinkerObjects.begin(), unitLinkerObjects.end(),
        [&unitDefaultBlocks, &filter](TIntermNode* node) {
            filter(unitDefaultBlocks, node);
    });

    auto itUnitBlock = unitDefaultBlocks.begin();
    for (; itUnitBlock != unitDefaultBlocks.end(); itUnitBlock++) {

        bool add = !mergeExistingOnly;
        auto itBlock = defaultBlocks.begin();

        for (; itBlock != defaultBlocks.end(); itBlock++) {
            TIntermSymbol* block = (*itBlock)->getAsSymbolNode();
            TIntermSymbol* unitBlock = (*itUnitBlock)->getAsSymbolNode();

            assert(block && unitBlock);

            // if the two default blocks match, then merge their definitions
            if (block->getType().getTypeName() == unitBlock->getType().getTypeName() &&
                block->getQualifier().storage == unitBlock->getQualifier().storage) {
                add = false;
                mergeBlockDefinitions(infoSink, block, unitBlock, &unit);
            }
        }
        if (add) {
            // push back on original list; won't change the size of the list we're iterating over
            linkerObjects.push_back(*itUnitBlock);
        }
    }
}